

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecAddNode(Abc_Obj_t *pObj,Vec_Int_t *vMap,Vec_Int_t *vGates,int fSkip,int fVeryVerbose)

{
  int Entry;
  
  if (fVeryVerbose != 0) {
    printf("%d:%d(%d) ",(ulong)(uint)vMap->nSize,(ulong)(uint)pObj->Id,
           (ulong)(uint)(pObj->field_6).iTemp);
    Abc_ObjPrint(_stdout,pObj);
  }
  Vec_IntPush(vMap,pObj->Id);
  if (fSkip == 0) {
    Entry = Mio_GateReadValue((Mio_Gate_t *)(pObj->field_5).pData);
  }
  else {
    Entry = -1;
  }
  Vec_IntPush(vGates,Entry);
  return;
}

Assistant:

void Sfm_DecAddNode( Abc_Obj_t * pObj, Vec_Int_t * vMap, Vec_Int_t * vGates, int fSkip, int fVeryVerbose )
{
    if ( fVeryVerbose )
        printf( "%d:%d(%d) ", Vec_IntSize(vMap), Abc_ObjId(pObj), pObj->iTemp );
    if ( fVeryVerbose )
        Abc_ObjPrint( stdout, pObj );
    Vec_IntPush( vMap, Abc_ObjId(pObj) );
    Vec_IntPush( vGates, fSkip ? -1 : Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
}